

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O0

void __thiscall AVO::Simulator::doStep(Simulator *this)

{
  size_type sVar1;
  KdTree *in_RDI;
  int agentNo_1;
  int agentNo;
  KdTree *in_stack_00000070;
  float in_stack_0000087c;
  Agent *in_stack_00000880;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  int iVar3;
  int iVar4;
  
  KdTree::buildAgentTree(in_stack_00000070);
  iVar3 = 0;
  while( true ) {
    iVar4 = iVar3;
    sVar1 = std::vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>::size
                      ((vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_> *)
                       &(in_RDI->agents_).
                        super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar1 <= iVar3) break;
    std::vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>::operator[]
              ((vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_> *)
               &(in_RDI->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4);
    Agent::computeNeighbors((Agent *)CONCAT44(iVar4,in_stack_fffffffffffffff0),in_RDI);
    std::vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>::operator[]
              ((vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_> *)
               &(in_RDI->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4);
    Agent::computeNewVelocity(in_stack_00000880,in_stack_0000087c);
    iVar3 = iVar4 + 1;
  }
  iVar3 = 0;
  while( true ) {
    iVar2 = iVar3;
    sVar1 = std::vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>::size
                      ((vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_> *)
                       &(in_RDI->agents_).
                        super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar1 <= iVar3) break;
    std::vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>::operator[]
              ((vector<AVO::Agent_*,_std::allocator<AVO::Agent_*>_> *)
               &(in_RDI->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar2);
    Agent::update((Agent *)CONCAT44(iVar4,iVar2),(float)((ulong)in_RDI >> 0x20));
    iVar3 = iVar2 + 1;
  }
  *(float *)&(in_RDI->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
             _M_impl.super__Vector_impl_data._M_finish =
       *(float *)((long)&(in_RDI->agents_).
                         super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>._M_impl.
                         super__Vector_impl_data._M_finish + 4) +
       *(float *)&(in_RDI->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
  return;
}

Assistant:

void Simulator::doStep() {
  kdTree_->buildAgentTree();

#ifdef _OPENMP
#pragma omp parallel for
#endif  // _OPENMP
  for (int agentNo = 0; agentNo < static_cast<int>(agents_.size()); ++agentNo) {
    agents_[agentNo]->computeNeighbors(kdTree_);
    agents_[agentNo]->computeNewVelocity(timeStep_);
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif  // _OPENMP
  for (int agentNo = 0; agentNo < static_cast<int>(agents_.size()); ++agentNo) {
    agents_[agentNo]->update(timeStep_);
  }

  globalTime_ += timeStep_;
}